

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extfilt.h
# Opt level: O2

clock_t __thiscall ExternalFilter::clock(ExternalFilter *this)

{
  int iVar1;
  uint uVar2;
  clock_t in_RAX;
  int iVar3;
  int in_ESI;
  
  if (this->enabled != false) {
    iVar1 = this->Vlp;
    iVar3 = iVar1 - this->Vhp;
    this->Vo = iVar3;
    this->Vlp = ((in_ESI - iVar1) * (this->w0lp >> 8) >> 0xc) + iVar1;
    uVar2 = (this->w0hp * iVar3 >> 0x14) + this->Vhp;
    this->Vhp = uVar2;
    return (ulong)uVar2;
  }
  this->Vlp = 0;
  this->Vhp = 0;
  this->Vo = in_ESI - this->mixer_DC;
  return in_RAX;
}

Assistant:

RESID_INLINE
void ExternalFilter::clock(sound_sample Vi)
{
  // This is handy for testing.
  if (!enabled) {
    // Remove maximum DC level since there is no filter to do it.
    Vlp = Vhp = 0;
    Vo = Vi - mixer_DC;
    return;
  }

  // delta_t is converted to seconds given a 1MHz clock by dividing
  // with 1 000 000.

  // Calculate filter outputs.
  // Vo  = Vlp - Vhp;
  // Vlp = Vlp + w0lp*(Vi - Vlp)*delta_t;
  // Vhp = Vhp + w0hp*(Vlp - Vhp)*delta_t;

  sound_sample dVlp = (w0lp >> 8)*(Vi - Vlp) >> 12;
  sound_sample dVhp = w0hp*(Vlp - Vhp) >> 20;
  Vo = Vlp - Vhp;
  Vlp += dVlp;
  Vhp += dVhp;
}